

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadGig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__filename;
  int iVar1;
  FILE *__stream;
  int c;
  FILE *pFile;
  char *pFileName;
  Gia_Man_t *pAig;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc == globalUtilOptind + 1)) {
    __filename = argv[globalUtilOptind];
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      fprintf((FILE *)pAbc->Err,"Cannot open input file \"%s\". \n",__filename);
      pAbc_local._4_4_ = 1;
    }
    else {
      fclose(__stream);
      Gia_ManReadGig(__filename);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: &read_gig [-h] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads design in GIG format\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadGig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManReadGig( char * pFileName );
    Gia_Man_t * pAig;
    char * pFileName;
    FILE * pFile;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pAig = Gia_ManReadGig( pFileName );
    //Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &read_gig [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         reads design in GIG format\n" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}